

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueriesDefaultValues
          (TextureFilterMinmaxParameterQueriesTestCase *this,Functions *gl)

{
  RenderContext *pRVar1;
  SupportedTextureType *pSVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  ObjectWrapper *this_00;
  undefined4 extraout_var;
  ObjectTraits *traits;
  Texture2D *this_01;
  pointer pSVar6;
  TestError *pTVar7;
  pointer ppSVar8;
  pointer pSVar9;
  GLint params;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  sampler;
  int local_4c;
  RenderContext *local_48;
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  local_40;
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  this_00 = (ObjectWrapper *)operator_new(0x18);
  local_48 = pRVar1;
  iVar4 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  traits = glu::objectTraits(OBJECTTYPE_SAMPLER);
  glu::ObjectWrapper::ObjectWrapper(this_00,(Functions *)CONCAT44(extraout_var,iVar4),traits);
  local_40.m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)7> *)this_00;
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glu::Sampler error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x21d);
  (*gl->getSamplerParameteriv)(*(deUint32 *)((long)local_40.m_data.ptr + 0x10),0x9366,&local_4c);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"getSamplerParameteriv error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x222);
  if (local_4c != 0x9367) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"getSamplerParameteriv value mismatch with expected default",
               "params == GL_WEIGHTED_AVERAGE_ARB",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
               ,0x223);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  ppSVar8 = (this->m_utils).m_supportedTextureTypes.
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar8 !=
      (this->m_utils).m_supportedTextureTypes.
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pSVar2 = *ppSVar8;
      (*gl->getTexParameteriv)(pSVar2->m_type,0x9366,&local_4c);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"getTexParameteriv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x22b);
      if (local_4c != 0x9367) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"getTexParameteriv value mismatch with expected default",
                   "params == GL_WEIGHTED_AVERAGE_ARB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                   ,0x22c);
LAB_00a2719e:
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*gl->getTexParameterIiv)(pSVar2->m_type,0x9366,&local_4c);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"getTexParameterIiv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x22f);
      if (local_4c != 0x9367) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"getTexParameterIiv value mismatch with expected default",
                   "params == GL_WEIGHTED_AVERAGE_ARB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                   ,0x230);
        goto LAB_00a2719e;
      }
      ppSVar8 = ppSVar8 + 1;
    } while (ppSVar8 !=
             (this->m_utils).m_supportedTextureTypes.
             super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_ES3_1_compatibility")
  ;
  pSVar9 = (this->m_utils).m_supportedTextureDataTypes.
           super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (this->m_utils).m_supportedTextureDataTypes.
           super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar9 != pSVar6) {
    do {
      if ((byte)(~bVar3 & ((byte)pSVar9->m_testFlags & 2) >> 1) == 0) {
        this_01 = (Texture2D *)operator_new(0x70);
        glu::Texture2D::Texture2D(this_01,local_48,pSVar9->m_format,pSVar9->m_type,0x20,0x20);
        (*this_01->_vptr_Texture2D[2])(this_01);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glu::Texture2D error occurred",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                        ,0x23e);
        (*gl->getTextureParameteriv)(this_01->m_glTexture,0x9366,&local_4c);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"getTextureParameteriv error occurred",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                        ,0x241);
        if (local_4c != 0x9367) {
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"getTextureParameteriv value mismatch with expected default",
                     "params == GL_WEIGHTED_AVERAGE_ARB",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                     ,0x242);
LAB_00a27216:
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*gl->getTextureParameterIiv)(this_01->m_glTexture,0x9366,&local_4c);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"getTextureParameterIiv error occurred",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                        ,0x245);
        if (local_4c != 0x9367) {
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"getTextureParameterIiv value mismatch with expected default",
                     "params == GL_WEIGHTED_AVERAGE_ARB",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                     ,0x246);
          goto LAB_00a27216;
        }
        (*this_01->_vptr_Texture2D[1])(this_01);
        pSVar6 = (this->m_utils).m_supportedTextureDataTypes.
                 super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 != pSVar6);
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::reset(&local_40);
  return;
}

Assistant:

void TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueriesDefaultValues(const glw::Functions& gl)
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	de::MovePtr<glu::Sampler> sampler		= de::MovePtr<glu::Sampler>(new glu::Sampler(renderContext));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Sampler error occurred");

	glw::GLint params;

	gl.getSamplerParameteriv(**sampler, GL_TEXTURE_REDUCTION_MODE_ARB, &params);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getSamplerParameteriv error occurred");
	TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getSamplerParameteriv value mismatch with expected default");

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter iter = m_utils.getSupportedTextureTypes().begin();
		 iter != m_utils.getSupportedTextureTypes().end(); ++iter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *iter;

		gl.getTexParameteriv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTexParameteriv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTexParameteriv value mismatch with expected default");

		gl.getTexParameterIiv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTexParameterIiv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTexParameterIiv value mismatch with expected default");
	}

	bool is_arb_es31_compatibility = m_context.getContextInfo().isExtensionSupported("GL_ARB_ES3_1_compatibility");

	for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter iter = m_utils.getSupportedTextureDataTypes().begin();
		 iter != m_utils.getSupportedTextureDataTypes().end(); ++iter)
	{
		if (iter->hasFlag(TextureFilterMinmaxUtils::COMPATIBILITY) && !is_arb_es31_compatibility)
			continue;

		de::MovePtr<glu::Texture2D> texture = de::MovePtr<glu::Texture2D>(new glu::Texture2D(
			renderContext, iter->m_format, iter->m_type, TEXTURE_FILTER_MINMAX_SIZE, TEXTURE_FILTER_MINMAX_SIZE));
		texture->upload();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

		gl.getTextureParameteriv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTextureParameteriv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTextureParameteriv value mismatch with expected default");

		gl.getTextureParameterIiv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTextureParameterIiv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTextureParameterIiv value mismatch with expected default");
	}
}